

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall DSectorPlaneInterpolation::Restore(DSectorPlaneInterpolation *this)

{
  sector_t *this_00;
  secplane_t *psVar1;
  splane *psVar2;
  bool bVar3;
  
  this_00 = this->sector;
  bVar3 = this->ceiling != false;
  psVar1 = &this_00->floorplane;
  if (bVar3) {
    psVar1 = &this_00->ceilingplane;
  }
  psVar1->D = this->bakheight;
  psVar2 = this_00->planes + 1;
  if (!bVar3) {
    psVar2 = this_00->planes;
  }
  psVar2->TexZ = this->baktexz;
  sector_t::SetAllVerticesDirty(this_00);
  P_RecalculateAttached3DFloors(this->sector);
  sector_t::CheckPortalPlane(this->sector,(uint)this->ceiling);
  return;
}

Assistant:

void DSectorPlaneInterpolation::Restore()
{
	if (!ceiling)
	{
		sector->floorplane.setD(bakheight);
		sector->SetPlaneTexZ(sector_t::floor, baktexz, true);
	}
	else
	{
		sector->ceilingplane.setD(bakheight);
		sector->SetPlaneTexZ(sector_t::ceiling, baktexz, true);
	}
	P_RecalculateAttached3DFloors(sector);
	sector->CheckPortalPlane(ceiling? sector_t::ceiling : sector_t::floor);
}